

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

int __thiscall
Js::ByteCodeWriter::AuxNoReg(ByteCodeWriter *this,OpCode op,void *buffer,int byteCount,int C1)

{
  uint uVar1;
  uint local_38;
  int local_34;
  OpLayoutAuxNoReg data;
  
  CheckOpen(this);
  uVar1 = InsertAuxiliaryData(this,buffer,byteCount);
  _local_38 = CONCAT44(C1,uVar1);
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_38,8,this);
  return uVar1;
}

Assistant:

int ByteCodeWriter::AuxNoReg(OpCode op, const void* buffer, int byteCount, int C1)
    {
        CheckOpen();

        //
        // Write the buffer's contents
        //

        int currentOffset = InsertAuxiliaryData(buffer, byteCount);

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutAuxNoReg data;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);

        return currentOffset;
    }